

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ColorEditOptionsPopup(float *col,ImGuiColorEditFlags flags)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  _func_void_void_ptr_char_ptr *p_Var5;
  bool bVar6;
  ImGuiID id;
  char *fmt;
  uint uVar7;
  ImGuiContext *pIVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  float fVar12;
  float fVar13;
  double dVar14;
  float fVar15;
  float fVar16;
  char buf [64];
  int iVar17;
  int local_8c;
  ImVec2 local_88;
  ImGuiContext *local_80;
  ImVec2 local_78 [9];
  
  if (((flags & 0x700000U) == 0 || (flags & 0x1800000U) == 0) &&
     (bVar6 = BeginPopup("context",0), pIVar8 = GImGui, bVar6)) {
    uVar9 = GImGui->ColorEditOptions;
    if ((flags & 0x700000U) == 0) {
      bVar6 = RadioButton("RGB",(bool)((byte)(uVar9 >> 0x14) & 1));
      uVar7 = (uVar9 & 0xff8fffff) + 0x100000;
      if (!bVar6) {
        uVar7 = uVar9;
      }
      bVar6 = RadioButton("HSV",(bool)((byte)(uVar7 >> 0x15) & 1));
      uVar9 = uVar9 & 0xff8fffff | 0x200000;
      if (!bVar6) {
        uVar9 = uVar7;
      }
      bVar6 = RadioButton("HEX",(bool)((byte)(uVar9 >> 0x16) & 1));
      if (bVar6) {
        uVar9 = uVar9 & 0xff8fffff | 0x400000;
      }
    }
    if ((flags & 0x1800000U) == 0) {
      if ((flags & 0x700000U) == 0) {
        Separator();
      }
      bVar6 = RadioButton("0..255",(bool)((byte)(uVar9 >> 0x17) & 1));
      uVar7 = (uVar9 & 0xfe7fffff) + 0x800000;
      if (!bVar6) {
        uVar7 = uVar9;
      }
      bVar6 = RadioButton("0.00..1.00",(bool)((byte)(uVar7 >> 0x18) & 1));
      uVar9 = uVar9 & 0xfe7fffff | 0x1000000;
      if (!bVar6) {
        uVar9 = uVar7;
      }
    }
    Separator();
    local_78[0].x = -1.0;
    local_78[0].y = 0.0;
    bVar6 = ButtonEx("Copy as..",local_78,0);
    if (bVar6) {
      id = ImGuiWindow::GetID(GImGui->CurrentWindow,"Copy",(char *)0x0);
      OpenPopupEx(id);
    }
    bVar6 = BeginPopup("Copy",0);
    if (bVar6) {
      fVar1 = *col;
      fVar2 = col[1];
      fVar12 = 1.0;
      if (fVar1 <= 1.0) {
        fVar12 = fVar1;
      }
      fVar15 = 1.0;
      if (fVar2 <= 1.0) {
        fVar15 = fVar2;
      }
      fVar3 = col[2];
      fVar16 = 1.0;
      if (fVar3 <= 1.0) {
        fVar16 = fVar3;
      }
      local_8c = 0xff;
      if ((flags & 2U) == 0) {
        fVar4 = col[3];
        fVar13 = 1.0;
        if (fVar4 <= 1.0) {
          fVar13 = fVar4;
        }
        local_8c = (int)((float)(~-(uint)(fVar4 < 0.0) & (uint)fVar13) * 255.0 + 0.5);
      }
      local_80 = pIVar8;
      if ((flags & 2U) == 0) {
        dVar14 = (double)col[3];
      }
      else {
        dVar14 = 1.0;
      }
      uVar11 = (uint)((float)(~-(uint)(fVar1 < 0.0) & (uint)fVar12) * 255.0 + 0.5);
      uVar10 = (uint)((float)(~-(uint)(fVar2 < 0.0) & (uint)fVar15) * 255.0 + 0.5);
      uVar7 = (uint)((float)(~-(uint)(fVar3 < 0.0) & (uint)fVar16) * 255.0 + 0.5);
      ImFormatString((char *)local_78,0x40,"(%.3ff, %.3ff, %.3ff, %.3ff)",(double)fVar1,
                     (double)fVar2,(double)fVar3,dVar14);
      local_88.x = 0.0;
      local_88.y = 0.0;
      bVar6 = Selectable((char *)local_78,false,0,&local_88);
      if ((bVar6) &&
         (p_Var5 = (GImGui->IO).SetClipboardTextFn, p_Var5 != (_func_void_void_ptr_char_ptr *)0x0))
      {
        (*p_Var5)((GImGui->IO).ClipboardUserData,(char *)local_78);
      }
      iVar17 = local_8c;
      ImFormatString((char *)local_78,0x40,"(%d,%d,%d,%d)",(ulong)uVar11,(ulong)uVar10,(ulong)uVar7,
                     local_8c);
      local_88.x = 0.0;
      local_88.y = 0.0;
      bVar6 = Selectable((char *)local_78,false,0,&local_88);
      if ((bVar6) &&
         (p_Var5 = (GImGui->IO).SetClipboardTextFn, p_Var5 != (_func_void_void_ptr_char_ptr *)0x0))
      {
        (*p_Var5)((GImGui->IO).ClipboardUserData,(char *)local_78);
      }
      pIVar8 = local_80;
      if ((flags & 2U) == 0) {
        fmt = "0x%02X%02X%02X%02X";
        iVar17 = local_8c;
      }
      else {
        fmt = "0x%02X%02X%02X";
      }
      ImFormatString((char *)local_78,0x40,fmt,(ulong)uVar11,(ulong)uVar10,(ulong)uVar7,iVar17);
      local_88.x = 0.0;
      local_88.y = 0.0;
      bVar6 = Selectable((char *)local_78,false,0,&local_88);
      if ((bVar6) &&
         (p_Var5 = (GImGui->IO).SetClipboardTextFn, p_Var5 != (_func_void_void_ptr_char_ptr *)0x0))
      {
        (*p_Var5)((GImGui->IO).ClipboardUserData,(char *)local_78);
      }
      EndPopup();
    }
    pIVar8->ColorEditOptions = uVar9;
    EndPopup();
  }
  return;
}

Assistant:

void ImGui::ColorEditOptionsPopup(const float* col, ImGuiColorEditFlags flags)
{
    bool allow_opt_inputs = !(flags & ImGuiColorEditFlags__InputsMask);
    bool allow_opt_datatype = !(flags & ImGuiColorEditFlags__DataTypeMask);
    if ((!allow_opt_inputs && !allow_opt_datatype) || !BeginPopup("context"))
        return;
    ImGuiContext& g = *GImGui;
    ImGuiColorEditFlags opts = g.ColorEditOptions;
    if (allow_opt_inputs)
    {
        if (RadioButton("RGB", (opts & ImGuiColorEditFlags_RGB) != 0)) opts = (opts & ~ImGuiColorEditFlags__InputsMask) | ImGuiColorEditFlags_RGB;
        if (RadioButton("HSV", (opts & ImGuiColorEditFlags_HSV) != 0)) opts = (opts & ~ImGuiColorEditFlags__InputsMask) | ImGuiColorEditFlags_HSV;
        if (RadioButton("HEX", (opts & ImGuiColorEditFlags_HEX) != 0)) opts = (opts & ~ImGuiColorEditFlags__InputsMask) | ImGuiColorEditFlags_HEX;
    }
    if (allow_opt_datatype)
    {
        if (allow_opt_inputs) Separator();
        if (RadioButton("0..255",     (opts & ImGuiColorEditFlags_Uint8) != 0)) opts = (opts & ~ImGuiColorEditFlags__DataTypeMask) | ImGuiColorEditFlags_Uint8;
        if (RadioButton("0.00..1.00", (opts & ImGuiColorEditFlags_Float) != 0)) opts = (opts & ~ImGuiColorEditFlags__DataTypeMask) | ImGuiColorEditFlags_Float;
    }

    if (allow_opt_inputs || allow_opt_datatype)
        Separator();
    if (Button("Copy as..", ImVec2(-1,0)))
        OpenPopup("Copy");
    if (BeginPopup("Copy"))
    {
        int cr = IM_F32_TO_INT8_SAT(col[0]), cg = IM_F32_TO_INT8_SAT(col[1]), cb = IM_F32_TO_INT8_SAT(col[2]), ca = (flags & ImGuiColorEditFlags_NoAlpha) ? 255 : IM_F32_TO_INT8_SAT(col[3]);
        char buf[64];
        ImFormatString(buf, IM_ARRAYSIZE(buf), "(%.3ff, %.3ff, %.3ff, %.3ff)", col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
        if (Selectable(buf))
            SetClipboardText(buf);
        ImFormatString(buf, IM_ARRAYSIZE(buf), "(%d,%d,%d,%d)", cr, cg, cb, ca);
        if (Selectable(buf))
            SetClipboardText(buf);
        if (flags & ImGuiColorEditFlags_NoAlpha)
            ImFormatString(buf, IM_ARRAYSIZE(buf), "0x%02X%02X%02X", cr, cg, cb);
        else
            ImFormatString(buf, IM_ARRAYSIZE(buf), "0x%02X%02X%02X%02X", cr, cg, cb, ca);
        if (Selectable(buf))
            SetClipboardText(buf);
        EndPopup();
    }

    g.ColorEditOptions = opts;
    EndPopup();
}